

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall Clasp::SatBuilder::addConstraint(SatBuilder *this,WeightLitVec *lits,weight_t bound)

{
  bool bVar1;
  uint uVar2;
  Literal LVar3;
  Solver *pSVar4;
  uint32 flags;
  int __oflag;
  SharedContext *in_RDI;
  WeightLiteral *end;
  WeightLiteral *x;
  WeightLitsRep rep;
  weight_t in_stack_000000b4;
  WeightLitVec *in_stack_000000b8;
  Solver *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Literal x_00;
  CPair in_stack_ffffffffffffffa0;
  WeightLiteral *local_40;
  WeightLitsRep local_38 [2];
  bool local_1;
  
  ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  bVar1 = SharedContext::ok(in_RDI);
  if (bVar1) {
    ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
    pSVar4 = SharedContext::master((SharedContext *)0x1ca9a9);
    WeightLitsRep::create(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
    uVar2 = WeightLitsRep::open(local_38,(char *)pSVar4,__oflag);
    x_00.rep_ = in_stack_ffffffffffffffa0.con[0]._4_4_;
    if ((uVar2 & 1) != 0) {
      for (local_40 = local_38[0].lits; x_00.rep_ = in_stack_ffffffffffffffa0.con[0]._4_4_,
          local_40 != local_38[0].lits + local_38[0].size; local_40 = local_40 + 1) {
        markOcc((SatBuilder *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),x_00);
      }
    }
    ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
    pSVar4 = SharedContext::master((SharedContext *)0x1caa37);
    flags = (uint32)((ulong)pSVar4 >> 0x20);
    LVar3 = lit_true();
    WeightConstraint::create
              ((Solver *)CONCAT44(LVar3.rep_,in_stack_ffffffffffffff98),x_00,(WeightLitsRep *)in_RDI
               ,flags);
    local_1 = WeightConstraint::CPair::ok((CPair *)&stack0xffffffffffffffa0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SatBuilder::addConstraint(WeightLitVec& lits, weight_t bound) {
	if (!ctx()->ok()) { return false; }
	WeightLitsRep rep = WeightLitsRep::create(*ctx()->master(), lits, bound);
	if (rep.open()) {
		for (const WeightLiteral* x = rep.lits, *end = rep.lits + rep.size; x != end; ++x) {
			markOcc(x->first);
		}
	}
	return WeightConstraint::create(*ctx()->master(), lit_true(), rep, 0u).ok();
}